

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

void * __thiscall CSnapshotBuilder::NewItem(CSnapshotBuilder *this,int Type,int ID,int Size)

{
  CSnapshotItem *this_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  CSnapshotItem *pObj;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int *local_8;
  
  if (((ulong)((long)*(int *)(in_RDI + 0x10000) + 0xc + (long)in_ECX +
              (long)(*(int *)(in_RDI + 0x11004) + 1) * 8) < 0x10000) &&
     (*(int *)(in_RDI + 0x11004) + 1 < 0x400)) {
    this_00 = (CSnapshotItem *)(in_RDI + *(int *)(in_RDI + 0x10000));
    mem_zero(in_RDI,in_stack_ffffffffffffffcc);
    CSnapshotItem::SetKey(this_00,in_ESI,in_EDX);
    *(undefined4 *)(in_RDI + (long)*(int *)(in_RDI + 0x11004) * 4 + 0x10004) =
         *(undefined4 *)(in_RDI + 0x10000);
    *(int *)(in_RDI + 0x10000) = *(int *)(in_RDI + 0x10000) + in_ECX + 4;
    *(int *)(in_RDI + 0x11004) = *(int *)(in_RDI + 0x11004) + 1;
    local_8 = CSnapshotItem::Data(this_00);
  }
  else {
    dbg_assert_imp(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x24ca48);
    dbg_assert_imp(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(char *)0x24ca77);
    local_8 = (int *)0x0;
  }
  return local_8;
}

Assistant:

void *CSnapshotBuilder::NewItem(int Type, int ID, int Size)
{
	if(m_DataSize + sizeof(CSnapshot) + sizeof(CSnapshotItem) + Size + (m_NumItems+1) * sizeof(int)*2 >= CSnapshot::MAX_SIZE ||
		m_NumItems+1 >= MAX_ITEMS)
	{
		// key and offset per item
		dbg_assert(m_DataSize + sizeof(CSnapshot) + m_NumItems * sizeof(int)*2 < CSnapshot::MAX_SIZE, "too much data");
		dbg_assert(m_NumItems < MAX_ITEMS, "too many items");
		return 0;
	}

	CSnapshotItem *pObj = (CSnapshotItem *)(m_aData + m_DataSize);

	mem_zero(pObj, sizeof(CSnapshotItem) + Size);
	pObj->SetKey(Type, ID);
	m_aOffsets[m_NumItems] = m_DataSize;
	m_DataSize += sizeof(CSnapshotItem) + Size;
	m_NumItems++;

	return pObj->Data();
}